

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuCreate.c
# Opt level: O0

void Fxu_CreateMatrixAddCube
               (Fxu_Matrix *p,Fxu_Cube *pCube,char *pSopCube,Vec_Int_t *vFanins,int *pOrder)

{
  bool bVar1;
  int local_40;
  int i;
  int Value;
  Fxu_Var *pVar;
  int *pOrder_local;
  Vec_Int_t *vFanins_local;
  char *pSopCube_local;
  Fxu_Cube *pCube_local;
  Fxu_Matrix *p_local;
  
  local_40 = 0;
  while( true ) {
    bVar1 = false;
    if (pSopCube[local_40] != ' ') {
      bVar1 = pSopCube[local_40] != '\0';
    }
    if (!bVar1) break;
    if (pSopCube[pOrder[local_40]] == '0') {
      Fxu_MatrixAddLiteral(p,pCube,p->ppVars[vFanins->pArray[pOrder[local_40]] * 2 + 1]);
    }
    else if (pSopCube[pOrder[local_40]] == '1') {
      Fxu_MatrixAddLiteral(p,pCube,p->ppVars[vFanins->pArray[pOrder[local_40]] << 1]);
    }
    local_40 = local_40 + 1;
  }
  return;
}

Assistant:

void Fxu_CreateMatrixAddCube( Fxu_Matrix * p, Fxu_Cube * pCube, char * pSopCube, Vec_Int_t * vFanins, int * pOrder )
{
    Fxu_Var * pVar;
    int Value, i;
    // add literals to the matrix
    Abc_CubeForEachVar( pSopCube, Value, i )
    {
        Value = pSopCube[pOrder[i]];
        if ( Value == '0' )
        {
            pVar = p->ppVars[ 2 * vFanins->pArray[pOrder[i]] + 1 ];  // CST
            Fxu_MatrixAddLiteral( p, pCube, pVar );
        }
        else if ( Value == '1' )
        {
            pVar = p->ppVars[ 2 * vFanins->pArray[pOrder[i]] ];  // CST
            Fxu_MatrixAddLiteral( p, pCube, pVar );
        }
    }
}